

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O2

void __thiscall PressDelayHandler::pressed(PressDelayHandler *this,QEvent *e,int delay)

{
  MouseEventSource MVar1;
  QMouseEvent *other;
  QWidget *ptr;
  long in_FS_OFFSET;
  QPointF local_40;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->pressDelayEvent).d == (QMouseEvent *)0x0) {
    other = copyMouseEvent(e);
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::reset
              (&this->pressDelayEvent,other);
    QBasicTimer::start(&this->pressDelayTimer,(Duration)((long)delay * 1000000),&this->super_QObject
                      );
    local_40 = QSinglePointEvent::globalPosition((QSinglePointEvent *)(this->pressDelayEvent).d);
    local_30 = QPointF::toPoint(&local_40);
    ptr = QApplication::widgetAt(&local_30);
    QWeakPointer<QObject>::assign<QObject>(&(this->mouseTarget).wp,&ptr->super_QObject);
    this->mouseButton = *(MouseButton *)((this->pressDelayEvent).d + 0x40);
    MVar1 = QMouseEvent::source();
    this->mouseEventSource = MVar1;
  }
  (**(code **)(*(long *)e + 0x10))(e,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pressed(QEvent *e, int delay)
    {
        if (!pressDelayEvent) {
            pressDelayEvent.reset(copyMouseEvent(e));
            using namespace std::chrono_literals;
            pressDelayTimer.start(delay * 1ms, this);
            mouseTarget = QApplication::widgetAt(pressDelayEvent->globalPosition().toPoint());
            mouseButton = pressDelayEvent->button();
            mouseEventSource = pressDelayEvent->source();
            qFGDebug("QFG: consuming/delaying mouse press");
        } else {
            qFGDebug("QFG: NOT consuming/delaying mouse press");
        }
        e->setAccepted(true);
    }